

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int freePage2(BtShared *pBt,MemPage *pMemPage,Pgno iPage)

{
  int iVar1;
  u32 uVar2;
  u32 nLeaf;
  int nFree;
  int rc;
  MemPage *pPage;
  MemPage *pPage1;
  MemPage *pMStack_30;
  Pgno iTrunk;
  MemPage *pTrunk;
  MemPage *pMStack_20;
  Pgno iPage_local;
  MemPage *pMemPage_local;
  BtShared *pBt_local;
  
  pMStack_30 = (MemPage *)0x0;
  pPage1._4_4_ = 0;
  pPage = pBt->pPage1;
  pTrunk._4_4_ = iPage;
  pMStack_20 = pMemPage;
  pMemPage_local = (MemPage *)pBt;
  if (iPage < 2) {
    iVar1 = sqlite3CorruptError(0x10dca);
    return iVar1;
  }
  if (pMemPage == (MemPage *)0x0) {
    _nFree = btreePageLookup(pBt,iPage);
  }
  else {
    _nFree = pMemPage;
    sqlite3PagerRef(pMemPage->pDbPage);
  }
  nLeaf = sqlite3PagerWrite(pPage->pDbPage);
  if (nLeaf == 0) {
    uVar2 = sqlite3Get4byte(pPage->aData + 0x24);
    sqlite3Put4byte(pPage->aData + 0x24,uVar2 + 1);
    if ((*(ushort *)&pMemPage_local->field_0x26 & 4) != 0) {
      if (((_nFree == (MemPage *)0x0) &&
          (nLeaf = btreeGetPage((BtShared *)pMemPage_local,pTrunk._4_4_,(MemPage **)&nFree,0),
          nLeaf != 0)) || (nLeaf = sqlite3PagerWrite(_nFree->pDbPage), nLeaf != 0))
      goto LAB_0014d926;
      memset(_nFree->aData,0,(ulong)_nFree->pBt->pageSize);
    }
    if ((*(char *)((long)pMemPage_local->aiOvfl + 7) == '\0') ||
       (ptrmapPut((BtShared *)pMemPage_local,pTrunk._4_4_,'\x02',0,(int *)&nLeaf), nLeaf == 0)) {
      if (uVar2 != 0) {
        pPage1._4_4_ = sqlite3Get4byte(pPage->aData + 0x20);
        nLeaf = btreeGetPage((BtShared *)pMemPage_local,pPage1._4_4_,&stack0xffffffffffffffd0,0);
        if (nLeaf != 0) goto LAB_0014d926;
        uVar2 = sqlite3Get4byte(pMStack_30->aData + 4);
        if ((*(uint *)((long)pMemPage_local->apOvfl + 0xc) >> 2) - 2 < uVar2) {
          nLeaf = sqlite3CorruptError(0x10dff);
          goto LAB_0014d926;
        }
        if (uVar2 < (*(uint *)((long)pMemPage_local->apOvfl + 0xc) >> 2) - 8) {
          nLeaf = sqlite3PagerWrite(pMStack_30->pDbPage);
          if (nLeaf == 0) {
            sqlite3Put4byte(pMStack_30->aData + 4,uVar2 + 1);
            sqlite3Put4byte(pMStack_30->aData + (uVar2 * 4 + 8),pTrunk._4_4_);
            if ((_nFree != (MemPage *)0x0) && ((*(ushort *)&pMemPage_local->field_0x26 & 4) == 0)) {
              sqlite3PagerDontWrite(_nFree->pDbPage);
            }
            nLeaf = btreeSetHasContent((BtShared *)pMemPage_local,pTrunk._4_4_);
          }
          goto LAB_0014d926;
        }
      }
      if (((_nFree != (MemPage *)0x0) ||
          (nLeaf = btreeGetPage((BtShared *)pMemPage_local,pTrunk._4_4_,(MemPage **)&nFree,0),
          nLeaf == 0)) && (nLeaf = sqlite3PagerWrite(_nFree->pDbPage), nLeaf == 0)) {
        sqlite3Put4byte(_nFree->aData,pPage1._4_4_);
        sqlite3Put4byte(_nFree->aData + 4,0);
        sqlite3Put4byte(pPage->aData + 0x20,pTrunk._4_4_);
      }
    }
  }
LAB_0014d926:
  if (_nFree != (MemPage *)0x0) {
    _nFree->isInit = '\0';
  }
  releasePage(_nFree);
  releasePage(pMStack_30);
  return nLeaf;
}

Assistant:

static int freePage2(BtShared *pBt, MemPage *pMemPage, Pgno iPage){
  MemPage *pTrunk = 0;                /* Free-list trunk page */
  Pgno iTrunk = 0;                    /* Page number of free-list trunk page */ 
  MemPage *pPage1 = pBt->pPage1;      /* Local reference to page 1 */
  MemPage *pPage;                     /* Page being freed. May be NULL. */
  int rc;                             /* Return Code */
  int nFree;                          /* Initial number of pages on free-list */

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( CORRUPT_DB || iPage>1 );
  assert( !pMemPage || pMemPage->pgno==iPage );

  if( iPage<2 ) return SQLITE_CORRUPT_BKPT;
  if( pMemPage ){
    pPage = pMemPage;
    sqlite3PagerRef(pPage->pDbPage);
  }else{
    pPage = btreePageLookup(pBt, iPage);
  }

  /* Increment the free page count on pPage1 */
  rc = sqlite3PagerWrite(pPage1->pDbPage);
  if( rc ) goto freepage_out;
  nFree = get4byte(&pPage1->aData[36]);
  put4byte(&pPage1->aData[36], nFree+1);

  if( pBt->btsFlags & BTS_SECURE_DELETE ){
    /* If the secure_delete option is enabled, then
    ** always fully overwrite deleted information with zeros.
    */
    if( (!pPage && ((rc = btreeGetPage(pBt, iPage, &pPage, 0))!=0) )
     ||            ((rc = sqlite3PagerWrite(pPage->pDbPage))!=0)
    ){
      goto freepage_out;
    }
    memset(pPage->aData, 0, pPage->pBt->pageSize);
  }

  /* If the database supports auto-vacuum, write an entry in the pointer-map
  ** to indicate that the page is free.
  */
  if( ISAUTOVACUUM ){
    ptrmapPut(pBt, iPage, PTRMAP_FREEPAGE, 0, &rc);
    if( rc ) goto freepage_out;
  }

  /* Now manipulate the actual database free-list structure. There are two
  ** possibilities. If the free-list is currently empty, or if the first
  ** trunk page in the free-list is full, then this page will become a
  ** new free-list trunk page. Otherwise, it will become a leaf of the
  ** first trunk page in the current free-list. This block tests if it
  ** is possible to add the page as a new free-list leaf.
  */
  if( nFree!=0 ){
    u32 nLeaf;                /* Initial number of leaf cells on trunk page */

    iTrunk = get4byte(&pPage1->aData[32]);
    rc = btreeGetPage(pBt, iTrunk, &pTrunk, 0);
    if( rc!=SQLITE_OK ){
      goto freepage_out;
    }

    nLeaf = get4byte(&pTrunk->aData[4]);
    assert( pBt->usableSize>32 );
    if( nLeaf > (u32)pBt->usableSize/4 - 2 ){
      rc = SQLITE_CORRUPT_BKPT;
      goto freepage_out;
    }
    if( nLeaf < (u32)pBt->usableSize/4 - 8 ){
      /* In this case there is room on the trunk page to insert the page
      ** being freed as a new leaf.
      **
      ** Note that the trunk page is not really full until it contains
      ** usableSize/4 - 2 entries, not usableSize/4 - 8 entries as we have
      ** coded.  But due to a coding error in versions of SQLite prior to
      ** 3.6.0, databases with freelist trunk pages holding more than
      ** usableSize/4 - 8 entries will be reported as corrupt.  In order
      ** to maintain backwards compatibility with older versions of SQLite,
      ** we will continue to restrict the number of entries to usableSize/4 - 8
      ** for now.  At some point in the future (once everyone has upgraded
      ** to 3.6.0 or later) we should consider fixing the conditional above
      ** to read "usableSize/4-2" instead of "usableSize/4-8".
      **
      ** EVIDENCE-OF: R-19920-11576 However, newer versions of SQLite still
      ** avoid using the last six entries in the freelist trunk page array in
      ** order that database files created by newer versions of SQLite can be
      ** read by older versions of SQLite.
      */
      rc = sqlite3PagerWrite(pTrunk->pDbPage);
      if( rc==SQLITE_OK ){
        put4byte(&pTrunk->aData[4], nLeaf+1);
        put4byte(&pTrunk->aData[8+nLeaf*4], iPage);
        if( pPage && (pBt->btsFlags & BTS_SECURE_DELETE)==0 ){
          sqlite3PagerDontWrite(pPage->pDbPage);
        }
        rc = btreeSetHasContent(pBt, iPage);
      }
      TRACE(("FREE-PAGE: %d leaf on trunk page %d\n",pPage->pgno,pTrunk->pgno));
      goto freepage_out;
    }
  }

  /* If control flows to this point, then it was not possible to add the
  ** the page being freed as a leaf page of the first trunk in the free-list.
  ** Possibly because the free-list is empty, or possibly because the 
  ** first trunk in the free-list is full. Either way, the page being freed
  ** will become the new first trunk page in the free-list.
  */
  if( pPage==0 && SQLITE_OK!=(rc = btreeGetPage(pBt, iPage, &pPage, 0)) ){
    goto freepage_out;
  }
  rc = sqlite3PagerWrite(pPage->pDbPage);
  if( rc!=SQLITE_OK ){
    goto freepage_out;
  }
  put4byte(pPage->aData, iTrunk);
  put4byte(&pPage->aData[4], 0);
  put4byte(&pPage1->aData[32], iPage);
  TRACE(("FREE-PAGE: %d new trunk page replacing %d\n", pPage->pgno, iTrunk));

freepage_out:
  if( pPage ){
    pPage->isInit = 0;
  }
  releasePage(pPage);
  releasePage(pTrunk);
  return rc;
}